

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_c.cpp
# Opt level: O2

spvc_result
spvc_compiler_get_entry_points
          (spvc_compiler compiler,spvc_entry_point **entry_points,size_t *num_entry_points)

{
  spvc_context_s *this;
  undefined8 *puVar1;
  spvc_result sVar2;
  EntryPoint *name;
  long lVar3;
  allocator local_279;
  size_t *local_278;
  spvc_entry_point new_entry;
  string local_240;
  SmallVector<spvc_entry_point,_8UL> translated;
  SmallVector<spirv_cross::EntryPoint,_8UL> entries;
  
  local_278 = num_entry_points;
  spirv_cross::Compiler::get_entry_points_and_stages
            (&entries,(compiler->compiler)._M_t.
                      super___uniq_ptr_impl<spirv_cross::Compiler,_std::default_delete<spirv_cross::Compiler>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_spirv_cross::Compiler_*,_std::default_delete<spirv_cross::Compiler>_>
                      .super__Head_base<0UL,_spirv_cross::Compiler_*,_false>._M_head_impl);
  translated.super_VectorView<spvc_entry_point>.ptr = (spvc_entry_point *)&translated.stack_storage;
  translated.super_VectorView<spvc_entry_point>.buffer_size = 0;
  translated.buffer_capacity = 8;
  spirv_cross::SmallVector<spvc_entry_point,_8UL>::reserve
            (&translated,entries.super_VectorView<spirv_cross::EntryPoint>.buffer_size);
  lVar3 = entries.super_VectorView<spirv_cross::EntryPoint>.buffer_size * 0x28;
  name = entries.super_VectorView<spirv_cross::EntryPoint>.ptr;
  do {
    if (lVar3 == 0) {
      puVar1 = (undefined8 *)operator_new(0xa0);
      puVar1[0x12] = 0;
      puVar1[0x13] = 0;
      puVar1[0x10] = 0;
      puVar1[0x11] = 0;
      puVar1[0xe] = 0;
      puVar1[0xf] = 0;
      puVar1[0xc] = 0;
      puVar1[0xd] = 0;
      puVar1[10] = 0;
      puVar1[0xb] = 0;
      puVar1[8] = 0;
      puVar1[9] = 0;
      puVar1[6] = 0;
      puVar1[7] = 0;
      puVar1[4] = 0;
      puVar1[5] = 0;
      *puVar1 = &PTR__TemporaryBuffer_004e8ac0;
      puVar1[2] = 0;
      puVar1[1] = puVar1 + 4;
      puVar1[3] = 8;
      spirv_cross::SmallVector<spvc_entry_point,_8UL>::operator=
                ((SmallVector<spvc_entry_point,_8UL> *)(puVar1 + 1),&translated);
      *entry_points = (spvc_entry_point *)puVar1[1];
      *local_278 = puVar1[2];
      new_entry._0_8_ = puVar1;
      spirv_cross::
      SmallVector<std::unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>,_8UL>
      ::push_back(&compiler->context->allocations,
                  (unique_ptr<ScratchMemoryAllocation,_std::default_delete<ScratchMemoryAllocation>_>
                   *)&new_entry);
      if (new_entry._0_8_ != 0) {
        (**(code **)(*(long *)new_entry._0_8_ + 8))();
      }
      sVar2 = SPVC_SUCCESS;
LAB_001e7142:
      spirv_cross::SmallVector<spvc_entry_point,_8UL>::~SmallVector(&translated);
      spirv_cross::SmallVector<spirv_cross::EntryPoint,_8UL>::~SmallVector(&entries);
      return sVar2;
    }
    new_entry.execution_model = name->execution_model;
    new_entry.name = spvc_context_s::allocate_name(compiler->context,&name->name);
    if (new_entry.name == (char *)0x0) {
      this = compiler->context;
      std::__cxx11::string::string((string *)&local_240,"Out of memory.",&local_279);
      spvc_context_s::report_error(this,&local_240);
      std::__cxx11::string::~string((string *)&local_240);
      sVar2 = SPVC_ERROR_OUT_OF_MEMORY;
      goto LAB_001e7142;
    }
    spirv_cross::SmallVector<spvc_entry_point,_8UL>::push_back(&translated,&new_entry);
    name = name + 1;
    lVar3 = lVar3 + -0x28;
  } while( true );
}

Assistant:

spvc_result spvc_compiler_get_entry_points(spvc_compiler compiler, const spvc_entry_point **entry_points,
                                           size_t *num_entry_points)
{
	SPVC_BEGIN_SAFE_SCOPE
	{
		auto entries = compiler->compiler->get_entry_points_and_stages();
		SmallVector<spvc_entry_point> translated;
		translated.reserve(entries.size());

		for (auto &entry : entries)
		{
			spvc_entry_point new_entry;
			new_entry.execution_model = static_cast<SpvExecutionModel>(entry.execution_model);
			new_entry.name = compiler->context->allocate_name(entry.name);
			if (!new_entry.name)
			{
				compiler->context->report_error("Out of memory.");
				return SPVC_ERROR_OUT_OF_MEMORY;
			}
			translated.push_back(new_entry);
		}

		auto ptr = spvc_allocate<TemporaryBuffer<spvc_entry_point>>();
		ptr->buffer = std::move(translated);
		*entry_points = ptr->buffer.data();
		*num_entry_points = ptr->buffer.size();
		compiler->context->allocations.push_back(std::move(ptr));
	}